

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O1

Matrix3x3 * CMU462::operator*(Matrix3x3 *__return_storage_ptr__,double c,Matrix3x3 *A)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  Matrix3x3 *cA;
  
  __return_storage_ptr__->entries[2].x = 0.0;
  __return_storage_ptr__->entries[2].y = 0.0;
  __return_storage_ptr__->entries[1].y = 0.0;
  __return_storage_ptr__->entries[1].z = 0.0;
  __return_storage_ptr__->entries[0].z = 0.0;
  __return_storage_ptr__->entries[1].x = 0.0;
  __return_storage_ptr__->entries[0].x = 0.0;
  __return_storage_ptr__->entries[0].y = 0.0;
  __return_storage_ptr__->entries[2].z = 0.0;
  dVar5 = A->entries[0].x * c;
  dVar6 = A->entries[0].y * c;
  auVar1._8_4_ = SUB84(dVar6,0);
  auVar1._0_8_ = dVar5;
  auVar1._12_4_ = (int)((ulong)dVar6 >> 0x20);
  __return_storage_ptr__->entries[0].x = dVar5;
  __return_storage_ptr__->entries[0].y = (double)auVar1._8_8_;
  dVar5 = A->entries[1].x * c;
  auVar2._8_4_ = SUB84(dVar5,0);
  auVar2._0_8_ = A->entries[0].z * c;
  auVar2._12_4_ = (int)((ulong)dVar5 >> 0x20);
  *(undefined1 (*) [16])&__return_storage_ptr__->entries[0].z = auVar2;
  dVar5 = A->entries[1].y * c;
  dVar6 = A->entries[1].z * c;
  auVar3._8_4_ = SUB84(dVar6,0);
  auVar3._0_8_ = dVar5;
  auVar3._12_4_ = (int)((ulong)dVar6 >> 0x20);
  __return_storage_ptr__->entries[1].y = dVar5;
  __return_storage_ptr__->entries[1].z = (double)auVar3._8_8_;
  dVar5 = A->entries[2].x * c;
  dVar6 = A->entries[2].y * c;
  auVar4._8_4_ = SUB84(dVar6,0);
  auVar4._0_8_ = dVar5;
  auVar4._12_4_ = (int)((ulong)dVar6 >> 0x20);
  __return_storage_ptr__->entries[2].x = dVar5;
  __return_storage_ptr__->entries[2].y = (double)auVar4._8_8_;
  __return_storage_ptr__->entries[2].z = c * A->entries[2].z;
  return __return_storage_ptr__;
}

Assistant:

Matrix3x3 operator*( double c, const Matrix3x3& A ) {

    Matrix3x3 cA;
    const double* Aij = (const double*) &A;
    double* cAij = (double*) &cA;

    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);

    return cA;
  }